

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpSocketImpl::Delete(TcpSocketImpl *this)

{
  long local_20;
  long *local_18;
  
  local_20 = 0;
  local_18 = (long *)operator_new(0x10);
  *local_18 = (long)&PTR___State_00146798;
  local_18[1] = (long)this;
  std::thread::_M_start_thread(&local_20,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  std::thread::detach();
  if (local_20 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

void TcpSocketImpl::Delete()
{
    thread([&]()
        {
            if (m_pBkRef == nullptr)
            {
                delete this;
                return;
            }
            TcpSocket* pSock = dynamic_cast<TcpSocket*>(m_pBkRef);
            lock_guard<mutex> lock(s_mxClientSocket);

            auto it = find_if(begin(s_lstClientSocket), end(s_lstClientSocket), [&](auto& item) noexcept { return item.get() == pSock; });
            if (it != end(s_lstClientSocket))
                s_lstClientSocket.erase(it);
            else
                delete pSock;
        }).detach();
}